

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

bool HasAddressTaken(VariableData *container)

{
  uint uVar1;
  uint uVar2;
  VmConstant *pVVar3;
  VmValue **ppVVar4;
  bool bVar5;
  VmValue *local_50;
  bool simpleUse;
  VmInstruction *inst;
  VmValue *value;
  uint e;
  uint i;
  VmConstant *user;
  uint userCount;
  uint userPos;
  VariableData *container_local;
  
  if ((container->isVmRegSpill & 1U) == 0) {
    user._4_4_ = 0;
    uVar1 = (container->users).count;
    for (; user._4_4_ < uVar1; user._4_4_ = user._4_4_ + 1) {
      pVVar3 = (container->users).data[user._4_4_];
      if (((pVVar3->super_VmValue).hasKnownSimpleUse & 1U) == 0) {
        if (((pVVar3->super_VmValue).hasKnownNonSimpleUse & 1U) != 0) {
          return true;
        }
        value._4_4_ = 0;
        uVar2 = (pVVar3->super_VmValue).users.count;
        for (; value._4_4_ < uVar2; value._4_4_ = value._4_4_ + 1) {
          local_50 = (pVVar3->super_VmValue).users.data[value._4_4_];
          if (local_50->typeID != 2) {
            local_50 = (VmValue *)0x0;
          }
          if (local_50 == (VmValue *)0x0) {
            __assert_fail("!\"invalid constant use\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                          ,0x160,"bool HasAddressTaken(VariableData *)");
          }
          if ((*(int *)&local_50[1]._vptr_VmValue < 0) || (6 < *(int *)&local_50[1]._vptr_VmValue))
          {
            if ((*(int *)&local_50[1]._vptr_VmValue < 8) ||
               ((0xe < *(int *)&local_50[1]._vptr_VmValue ||
                (ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                     ((SmallArray<VmValue_*,_4U> *)&local_50[1].typeID,0),
                (VmConstant *)*ppVVar4 != pVVar3)))) {
              if ((*(int *)&local_50[1]._vptr_VmValue == 0x1b) &&
                 ((ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                       ((SmallArray<VmValue_*,_4U> *)&local_50[1].typeID,0),
                  (VmConstant *)*ppVVar4 == pVVar3 ||
                  (ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                       ((SmallArray<VmValue_*,_4U> *)&local_50[1].typeID,2),
                  (VmConstant *)*ppVVar4 == pVVar3)))) {
                bVar5 = true;
              }
              else if ((*(int *)&local_50[1]._vptr_VmValue == 0x1a) &&
                      (ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                           ((SmallArray<VmValue_*,_4U> *)&local_50[1].typeID,0),
                      (VmConstant *)*ppVVar4 == pVVar3)) {
                bVar5 = true;
              }
              else if ((*(int *)&local_50[1]._vptr_VmValue == 0x20) ||
                      (*(int *)&local_50[1]._vptr_VmValue == 0x1f)) {
                bVar5 = (pVVar3->isReference & 1U) != 0;
              }
              else if (((*(int *)&local_50[1]._vptr_VmValue < 0x33) ||
                       (0x43 < *(int *)&local_50[1]._vptr_VmValue)) ||
                      (ppVVar4 = SmallArray<VmValue_*,_4U>::operator[]
                                           ((SmallArray<VmValue_*,_4U> *)&local_50[1].typeID,1),
                      (VmConstant *)*ppVVar4 != pVVar3)) {
                bVar5 = false;
              }
              else {
                bVar5 = true;
              }
            }
            else {
              bVar5 = true;
            }
          }
          else {
            bVar5 = true;
          }
          if (!bVar5) {
            (pVVar3->super_VmValue).hasKnownNonSimpleUse = true;
            return true;
          }
        }
        (pVVar3->super_VmValue).hasKnownSimpleUse = true;
      }
      else if ((((pVVar3->super_VmValue).hasKnownNonSimpleUse ^ 0xffU) & 1) == 0) {
        __assert_fail("!user->hasKnownNonSimpleUse",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                      ,0x128,"bool HasAddressTaken(VariableData *)");
      }
    }
  }
  return false;
}

Assistant:

bool HasAddressTaken(VariableData *container)
{
	if(container->isVmRegSpill)
		return false;

	for(unsigned userPos = 0, userCount = container->users.count; userPos < userCount; userPos++)
	{
		VmConstant *user = container->users.data[userPos];

		if(user->hasKnownSimpleUse)
		{
			assert(!user->hasKnownNonSimpleUse);
			continue;
		}

		if(user->hasKnownNonSimpleUse)
			return true;

		for(unsigned i = 0, e = user->users.count; i < e; i++)
		{
			VmValue *value = user->users.data[i];

			if(VmInstruction *inst = value->typeID == VmInstruction::myTypeID ? static_cast<VmInstruction*>(value) : NULL)
			{
				bool simpleUse = false;

				if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
				{
					simpleUse = true;
				}
				else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
				{
					simpleUse = true;
				}
				else if(inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL)
				{
					if(user->isReference)
						simpleUse = true;
					else
						simpleUse = false;
				}
				else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
				{
					simpleUse = true;
				}
				else
				{
					simpleUse = false;
				}

				if(!simpleUse)
				{
					user->hasKnownNonSimpleUse = true;

					return true;
				}
			}
			else
			{
				assert(!"invalid constant use");
			}
		}

		user->hasKnownSimpleUse = true;
	}

	return false;
}